

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_size(int handle,LONGLONG *filesize)

{
  FILE *__stream;
  int iVar1;
  __off64_t __off;
  __off64_t _Var2;
  __off64_t *in_RSI;
  int in_EDI;
  FILE *diskfile;
  off_t position2;
  off_t position1;
  int local_4;
  
  __stream = (FILE *)handleTable[in_EDI].fileptr;
  __off = ftello64(__stream);
  if (__off < 0) {
    local_4 = 0x74;
  }
  else {
    iVar1 = fseeko64(__stream,0,2);
    if (iVar1 == 0) {
      _Var2 = ftello64(__stream);
      if (_Var2 < 0) {
        local_4 = 0x74;
      }
      else {
        iVar1 = fseeko64(__stream,__off,0);
        if (iVar1 == 0) {
          *in_RSI = _Var2;
          local_4 = 0;
        }
        else {
          local_4 = 0x74;
        }
      }
    }
    else {
      local_4 = 0x74;
    }
  }
  return local_4;
}

Assistant:

int file_size(int handle, LONGLONG *filesize)
/*
  return the size of the file in bytes
*/
{
    OFF_T position1,position2;
    FILE *diskfile;

    diskfile = handleTable[handle].fileptr;

#if defined(_MSC_VER) && (_MSC_VER >= 1400)
 
/* call the VISUAL C++ version of the routines which support */
/*  Large Files (> 2GB) if they are supported (since VC 8.0)  */

    position1 = _ftelli64(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (_fseeki64(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = _ftelli64(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (_fseeki64(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#elif _FILE_OFFSET_BITS - 0 == 64

/* call the newer ftello and fseeko routines , which support */
/*  Large Files (> 2GB) if they are supported.  */

    position1 = ftello(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (fseeko(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = ftello(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (fseeko(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#else

    position1 = ftell(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (fseek(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = ftell(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (fseek(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#endif

    *filesize = (LONGLONG) position2;
    
    return(0);
}